

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O1

void sysbvm_bytecodeJit_addSourcePositionRecord
               (sysbvm_bytecodeJit_t *jit,sysbvm_functionBytecode_t *functionBytecode,
               uint16_t bytecodePC,size_t nativePC)

{
  sysbvm_tuple_t sourcePosition;
  
  if (((functionBytecode->debugSourcePositions == 0) ||
      (sourcePosition =
            sysbvm_orderedOffsetTable_findValueWithOffset
                      (jit->context,functionBytecode->debugSourcePositions,(uint)bytecodePC),
      sourcePosition == 0)) &&
     (sourcePosition = functionBytecode->sourcePosition, sourcePosition == 0)) {
    return;
  }
  sysbvm_bytecodeJit_addSourcePositionRecordWith(jit,nativePC,sourcePosition);
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_addSourcePositionRecord(sysbvm_bytecodeJit_t *jit, sysbvm_functionBytecode_t *functionBytecode, uint16_t bytecodePC, size_t nativePC)
{
    if(functionBytecode->debugSourcePositions)
    {
        sysbvm_tuple_t foundDebugPosition = sysbvm_orderedOffsetTable_findValueWithOffset(jit->context, functionBytecode->debugSourcePositions, bytecodePC);
        if(foundDebugPosition)
        {
            sysbvm_bytecodeJit_addSourcePositionRecordWith(jit, nativePC, foundDebugPosition);
            return;
        }
    }

    if(functionBytecode->sourcePosition)
        sysbvm_bytecodeJit_addSourcePositionRecordWith(jit, nativePC, functionBytecode->sourcePosition);
}